

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O1

void nonius::
     go<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>
               (configuration *cfg,
               __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
               first,__normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
                     last,reporter *rep)

{
  pointer pcVar1;
  configuration cfg_00;
  environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> eVar2;
  parameters *ppVar3;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  last_00;
  string *in_R8;
  CompleteType<detail::ResultOf<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2389:47)_()>_>
  samples;
  vector<nonius::parameters,_std::allocator<nonius::parameters>_> all_params;
  vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> benchmarks;
  __alloc_node_gen_t __alloc_node_gen;
  environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> env;
  CompleteType<detail::ResultOf<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2384:44)_()>_>
  plan;
  undefined8 in_stack_fffffffffffffb68;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  in_stack_fffffffffffffb78;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  in_stack_fffffffffffffb80;
  pointer in_stack_fffffffffffffb88;
  pointer in_stack_fffffffffffffba0;
  pointer ppVar4;
  pointer in_stack_fffffffffffffba8;
  pointer ppVar5;
  pointer in_stack_fffffffffffffbb0;
  pointer in_stack_fffffffffffffbb8;
  pointer pbVar6;
  pointer in_stack_fffffffffffffbc0;
  pointer pbVar7;
  pointer in_stack_fffffffffffffbc8;
  undefined1 *puVar8;
  undefined8 in_stack_fffffffffffffbd8;
  long in_stack_fffffffffffffbe0;
  undefined8 in_stack_fffffffffffffbe8;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_true>_>_>
  _Var9;
  configuration *pcVar10;
  pointer pdVar11;
  duration<double,_std::ratio<1L,_1000000000L>_> dVar12;
  undefined1 in_stack_fffffffffffffc10 [88];
  duration<double,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffffc68;
  undefined8 in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc80;
  duration<double,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  undefined8 in_stack_fffffffffffffc98;
  undefined8 in_stack_fffffffffffffca0;
  undefined8 in_stack_fffffffffffffca8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_348;
  _Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false> local_310;
  execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> local_2f8;
  param_configuration local_298;
  sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> local_1f0;
  configuration local_178;
  
  reporter::configure(rep,cfg);
  detail::measure_environment<std::chrono::_V2::system_clock>
            ((environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> *)
             &stack0xfffffffffffffc68,rep);
  (*rep->_vptr_reporter[10])(rep);
  pcVar1 = (cfg->filter_pattern)._M_dataplus._M_p;
  puVar8 = &stack0xfffffffffffffbe0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffbd0,pcVar1,
             pcVar1 + (cfg->filter_pattern)._M_string_length);
  filter_benchmarks<__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>
            ((vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *)
             &stack0xfffffffffffffbb8,(nonius *)first._M_current,last,
             (benchmark *)&stack0xfffffffffffffbd0,in_R8);
  if (puVar8 != &stack0xfffffffffffffbe0) {
    operator_delete(puVar8,in_stack_fffffffffffffbe0 + 1);
  }
  local_298.map.
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_buckets = (__buckets_ptr)0x0;
  local_298.map.
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_bucket_count =
       (cfg->params).map.
       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
       ._M_h._M_bucket_count;
  local_298.map.
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  last_00._M_current =
       (duration<double,_std::ratio<1L,_1000000000L>_> *)
       (cfg->params).map.
       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
       ._M_h._M_element_count;
  ppVar3 = &(cfg->params).map;
  local_298.map.
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_rehash_policy._M_max_load_factor =
       (ppVar3->
       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
       )._M_h._M_rehash_policy._M_max_load_factor;
  local_298.map.
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_rehash_policy._4_4_ =
       *(undefined4 *)
        &(ppVar3->
         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
         )._M_h._M_rehash_policy.field_0x4;
  local_298.map.
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_rehash_policy._M_next_resize =
       (cfg->params).map.
       super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
       ._M_h._M_rehash_policy._M_next_resize;
  local_298.map.
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_298.map.
  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
  ._M_h._M_element_count = (size_type)last_00._M_current;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,nonius::param>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,nonius::param>,std::allocator<std::pair<std::__cxx11::string_const,nonius::param>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_298,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)&cfg->params,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_true>_>_>
              *)&stack0xfffffffffffffbf0);
  local_298.run.initialized = false;
  if ((cfg->params).run.initialized == true) {
    optional<nonius::run_configuration>::construct
              (&local_298.run,(run_configuration *)&(cfg->params).run);
  }
  generate_params((vector<nonius::parameters,_std::allocator<nonius::parameters>_> *)
                  &stack0xfffffffffffffba0,&local_298);
  optional<nonius::run_configuration>::destroy(&local_298.run);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_298);
  if (in_stack_fffffffffffffba0 != in_stack_fffffffffffffba8) {
    ppVar4 = in_stack_fffffffffffffba0;
    ppVar5 = in_stack_fffffffffffffba8;
    do {
      (*rep->_vptr_reporter[0xb])(rep);
      pbVar6 = in_stack_fffffffffffffbb8;
      pbVar7 = in_stack_fffffffffffffbc0;
      if (in_stack_fffffffffffffbb8 != in_stack_fffffffffffffbc0) {
        do {
          (*rep->_vptr_reporter[0xc])(rep,in_stack_fffffffffffffbb8);
          dVar12.__r = (rep)&stack0xfffffffffffffc68;
          user_code<nonius::go<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>(nonius::configuration,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,nonius::reporter&)::_lambda()_1_>
                    ((CompleteType<detail::ResultOf<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2384:44)_()>_>
                      *)&stack0xfffffffffffffca8,(nonius *)rep,(reporter *)&stack0xfffffffffffffbf0,
                     (anon_class_32_4_9fe3b10c *)last_00._M_current);
          execution_plan::operator_cast_to_execution_plan
                    (&local_2f8,(execution_plan *)&stack0xfffffffffffffca8);
          reporter::measurement_start(rep,&local_2f8);
          if (local_2f8.benchmark.f._M_t.
              super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
              ._M_t.
              super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
              .super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>.
              _M_head_impl !=
              (__uniq_ptr_data<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>,_true,_true>
               )0x0) {
            (*(*(_func_int ***)
                local_2f8.benchmark.f._M_t.
                super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
                ._M_t.
                super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
                .super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>.
                _M_head_impl)[4])();
          }
          local_2f8.benchmark.f._M_t.
          super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
          ._M_t.
          super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
          .super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>._M_head_impl
               = (unique_ptr<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
                  )(__uniq_ptr_data<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>,_true,_true>
                    )0x0;
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_2f8.params);
          _Var9._M_h = (__hashtable_alloc *)&stack0xfffffffffffffca8;
          pdVar11 = (pointer)&stack0xfffffffffffffc68;
          pcVar10 = cfg;
          user_code<nonius::go<std::chrono::_V2::system_clock,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>(nonius::configuration,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,nonius::reporter&)::_lambda()_2_>
                    ((CompleteType<detail::ResultOf<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bitshifter[P]radixsort_thirdparty_nonius_nonius_hpp:2389:47)_()>_>
                      *)&stack0xfffffffffffffb78,(nonius *)rep,(reporter *)&stack0xfffffffffffffbf0,
                     (anon_class_24_3_b965e527 *)last_00._M_current);
          last_00._M_current = (duration<double,_std::ratio<1L,_1000000000L>_> *)&local_1f0;
          std::
          vector<std::chrono::duration<double,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1l>>>>
          ::
          vector<__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,void>
                    ((vector<std::chrono::duration<double,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1l>>>>
                      *)&stack0xfffffffffffffbf0,in_stack_fffffffffffffb78,in_stack_fffffffffffffb80
                     ,(allocator_type *)last_00._M_current);
          (*rep->_vptr_reporter[0xe])
                    (rep,(sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                          *)&stack0xfffffffffffffbf0);
          if (_Var9._M_h != (__hashtable_alloc *)0x0) {
            operator_delete(_Var9._M_h,(long)pdVar11 - (long)_Var9._M_h);
          }
          if (cfg->no_analysis == false) {
            (*rep->_vptr_reporter[0xf])(rep);
            last_00._M_current = in_stack_fffffffffffffb80._M_current;
            configuration::configuration(&local_178,cfg);
            cfg_00.confidence_interval = (double)in_stack_fffffffffffffc70;
            cfg_00._0_8_ = in_stack_fffffffffffffc68.__r;
            cfg_00.resamples = (int)in_stack_fffffffffffffc78;
            cfg_00._20_4_ = SUB84(in_stack_fffffffffffffc78,4);
            cfg_00.title._M_dataplus._M_p = (pointer)in_stack_fffffffffffffc80;
            cfg_00.title._M_string_length = (size_type)in_stack_fffffffffffffc88.__r;
            cfg_00.title.field_2._0_4_ = (int)in_stack_fffffffffffffc90;
            cfg_00.title.field_2._4_4_ = SUB84(in_stack_fffffffffffffc90,4);
            cfg_00.title.field_2._8_4_ = (int)in_stack_fffffffffffffc98;
            cfg_00.title.field_2._12_4_ = SUB84(in_stack_fffffffffffffc98,4);
            cfg_00.output_file._M_dataplus._M_p = (pointer)in_stack_fffffffffffffca0;
            cfg_00.output_file._M_string_length = in_stack_fffffffffffffb68;
            cfg_00.output_file.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffba0;
            cfg_00.output_file.field_2._8_8_ = in_stack_fffffffffffffb78._M_current;
            cfg_00.reporter._M_dataplus._M_p = (pointer)last_00._M_current;
            cfg_00.reporter._M_string_length = (size_type)in_stack_fffffffffffffb88;
            cfg_00.reporter.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffba8;
            cfg_00.reporter.field_2._8_8_ = in_stack_fffffffffffffbc0;
            cfg_00.filter_pattern._M_dataplus._M_p = (pointer)ppVar4;
            cfg_00.filter_pattern._M_string_length = (size_type)ppVar5;
            cfg_00.filter_pattern.field_2._M_allocated_capacity =
                 (size_type)in_stack_fffffffffffffbb0;
            cfg_00.filter_pattern.field_2._8_8_ = pbVar6;
            cfg_00._152_8_ = pbVar7;
            cfg_00.params.map.
            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
            ._M_h._M_buckets = (__buckets_ptr)in_stack_fffffffffffffbc8;
            cfg_00.params.map.
            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
            ._M_h._M_bucket_count = (size_type)puVar8;
            cfg_00.params.map.
            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
            ._M_h._M_before_begin._M_nxt = (_Hash_node_base *)in_stack_fffffffffffffbd8;
            cfg_00.params.map.
            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
            ._M_h._M_element_count = in_stack_fffffffffffffbe0;
            cfg_00.params.map.
            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
            ._M_h._M_rehash_policy._0_8_ = in_stack_fffffffffffffbe8;
            cfg_00.params.map.
            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
            ._M_h._M_rehash_policy._M_next_resize = (size_t)_Var9._M_h;
            cfg_00.params.map.
            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
            ._M_h._M_single_bucket = (__node_base_ptr)pcVar10;
            cfg_00.params.run.storage.__align = (anon_struct_8_0_00000001_for___align)pdVar11;
            cfg_00.params.run.storage._8_8_ = dVar12.__r;
            cfg_00.params.run.storage._16_88_ = in_stack_fffffffffffffc10;
            cfg_00.params.run._104_8_ = in_stack_fffffffffffffc68.__r;
            eVar2.clock_resolution.outliers.samples_seen = (int)in_stack_fffffffffffffc78;
            eVar2.clock_resolution.outliers.low_severe = SUB84(in_stack_fffffffffffffc78,4);
            eVar2.clock_resolution.mean.__r = (rep)in_stack_fffffffffffffc70;
            eVar2.clock_resolution.outliers.low_mild = (int)in_stack_fffffffffffffc80;
            eVar2.clock_resolution.outliers.high_mild = SUB84(in_stack_fffffffffffffc80,4);
            eVar2.clock_resolution._24_8_ = in_stack_fffffffffffffc88.__r;
            eVar2.clock_cost.mean.__r = (rep)in_stack_fffffffffffffc90;
            eVar2.clock_cost.outliers.samples_seen = (int)in_stack_fffffffffffffc98;
            eVar2.clock_cost.outliers.low_severe = SUB84(in_stack_fffffffffffffc98,4);
            eVar2.clock_cost.outliers.low_mild = (int)in_stack_fffffffffffffca0;
            eVar2.clock_cost.outliers.high_mild = SUB84(in_stack_fffffffffffffca0,4);
            eVar2.clock_cost.outliers.high_severe = (int)in_stack_fffffffffffffca8;
            eVar2.clock_cost._28_4_ = SUB84(in_stack_fffffffffffffca8,4);
            in_stack_fffffffffffffb80._M_current = last_00._M_current;
            detail::
            analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>
                      ((sample_analysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
                        *)&stack0xfffffffffffffbf0,(detail *)&local_178,cfg_00,eVar2,
                       in_stack_fffffffffffffb78,last_00);
            optional<nonius::run_configuration>::destroy(&local_178.params.run);
            std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)&local_178.params);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.filter_pattern._M_dataplus._M_p != &local_178.filter_pattern.field_2) {
              operator_delete(local_178.filter_pattern._M_dataplus._M_p,
                              local_178.filter_pattern.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.reporter._M_dataplus._M_p != &local_178.reporter.field_2) {
              operator_delete(local_178.reporter._M_dataplus._M_p,
                              local_178.reporter.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.output_file._M_dataplus._M_p != &local_178.output_file.field_2) {
              operator_delete(local_178.output_file._M_dataplus._M_p,
                              local_178.output_file.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178.title._M_dataplus._M_p != &local_178.title.field_2) {
              operator_delete(local_178.title._M_dataplus._M_p,
                              local_178.title.field_2._M_allocated_capacity + 1);
            }
            sample_analysis::operator_cast_to_sample_analysis
                      (&local_1f0,(sample_analysis *)&stack0xfffffffffffffbf0);
            (*rep->_vptr_reporter[0x10])(rep,&local_1f0);
            if (local_1f0.samples.
                super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_1f0.samples.
                              super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_1f0.samples.
                                    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_1f0.samples.
                                    super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (_Var9._M_h != (__hashtable_alloc *)0x0) {
              operator_delete(_Var9._M_h,(long)pdVar11 - (long)_Var9._M_h);
            }
          }
          (*rep->_vptr_reporter[0x12])(rep);
          if (in_stack_fffffffffffffb78._M_current !=
              (duration<double,_std::ratio<1L,_1000000000L>_> *)0x0) {
            operator_delete(in_stack_fffffffffffffb78._M_current,
                            (long)in_stack_fffffffffffffb88 -
                            (long)in_stack_fffffffffffffb78._M_current);
          }
          if (local_310._M_head_impl != (concept *)0x0) {
            (*(local_310._M_head_impl)->_vptr_concept[4])();
          }
          local_310._M_head_impl = (concept *)0x0;
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&local_348);
          in_stack_fffffffffffffbb8 = in_stack_fffffffffffffbb8 + 1;
        } while (in_stack_fffffffffffffbb8 != in_stack_fffffffffffffbc0);
      }
      (*rep->_vptr_reporter[0x13])(rep);
      in_stack_fffffffffffffba0 = in_stack_fffffffffffffba0 + 1;
      in_stack_fffffffffffffbb8 = pbVar6;
      in_stack_fffffffffffffbc0 = pbVar7;
    } while (in_stack_fffffffffffffba0 != in_stack_fffffffffffffba8);
  }
  (*rep->_vptr_reporter[0x14])(rep);
  std::vector<nonius::parameters,_std::allocator<nonius::parameters>_>::~vector
            ((vector<nonius::parameters,_std::allocator<nonius::parameters>_> *)
             &stack0xfffffffffffffba0);
  std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>::~vector
            ((vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *)
             &stack0xfffffffffffffbb8);
  return;
}

Assistant:

void go(configuration cfg, Iterator first, Iterator last, reporter& rep) {
        rep.configure(cfg);

        auto env = detail::measure_environment<Clock>(rep);
        rep.suite_start();

        auto benchmarks = filter_benchmarks(first, last, cfg.filter_pattern);
        auto all_params = generate_params(cfg.params);

        for (auto&& params : all_params) {
            rep.params_start(params);
            for (auto&& bench : benchmarks) {
                rep.benchmark_start(bench.name);

                auto plan = user_code(rep, [&]{
                    return bench.template prepare<Clock>(cfg, params, env);
                });

                rep.measurement_start(plan);
                auto samples = user_code(rep, [&]{
                    return plan.template run<Clock>(cfg, env);
                });
                rep.measurement_complete(std::vector<fp_seconds>(samples.begin(), samples.end()));

                if(!cfg.no_analysis) {
                    rep.analysis_start();
                    auto analysis = detail::analyse(cfg, env, samples.begin(), samples.end());
                    rep.analysis_complete(analysis);
                }

                rep.benchmark_complete();
            }
            rep.params_complete();
        }

        rep.suite_complete();
    }